

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ProxyClient::ProxyClient
          (ProxyClient *this,CommissionerImpl *aCommissioner,CoapSecure *aBrClient)

{
  event_base *aEventBase;
  CoapSecure *aBrClient_local;
  CommissionerImpl *aCommissioner_local;
  ProxyClient *this_local;
  
  this->mCommissioner = aCommissioner;
  ProxyEndpoint::ProxyEndpoint(&this->mEndpoint,aBrClient);
  aEventBase = CommissionerImpl::GetEventBase(aCommissioner);
  coap::Coap::Coap(&this->mCoap,aEventBase,&(this->mEndpoint).super_Endpoint);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mMeshLocalPrefix);
  return;
}

Assistant:

ProxyClient::ProxyClient(CommissionerImpl &aCommissioner, coap::CoapSecure &aBrClient)
    : mCommissioner(aCommissioner)
    , mEndpoint(aBrClient)
    , mCoap(aCommissioner.GetEventBase(), mEndpoint)
{
}